

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O1

vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL> *
__thiscall
estl::
vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
operator=(vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
          *this,vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                *other)

{
  long *plVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  long lVar5;
  size_type sVar6;
  
  if (this != other) {
    sVar6 = other->size_;
    if (sVar6 != 0) {
      lVar5 = sVar6 << 5;
      do {
        pvVar2 = this->data_ptr_;
        pvVar3 = other->data_ptr_;
        plVar1 = (long *)((long)&pvVar2[-1]._M_dataplus._M_p + lVar5);
        *plVar1 = (long)(plVar1 + 2);
        lVar4 = *(long *)((long)&pvVar3[-1]._M_dataplus._M_p + lVar5);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&pvVar2[-1]._M_dataplus._M_p + lVar5),lVar4,
                   *(long *)((long)&pvVar3[-1]._M_string_length + lVar5) + lVar4);
        sVar6 = sVar6 - 1;
        lVar5 = lVar5 + -0x20;
      } while (sVar6 != 0);
    }
    this->size_ = other->size_;
  }
  return this;
}

Assistant:

vector_s& operator=(const vector_s& other)
    {
        // NOTE: The reinterpret cast is needed as the pointer types can potentially
        //       be different if the capacities of the vectors are different.
        //       As we merely need to check the pointer adresses it's ok with
        //       with this "crude" cast here!
        if (reinterpret_cast<void*>(this) != reinterpret_cast<const void*>(&other)) // prevent self-assignment
        {
            for (size_type i = other.size(); i > 0; ) {
                --i;
                const pointer insert_ptr = data_ptr_ + i;
                new (insert_ptr) value_type(other[i]);
            }
            size_ = other.size();
        }
        return *this;
    }